

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::FieldConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  FieldDescriptor *pFVar1;
  AlphaNum *a;
  AlphaNum AStack_a8;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string field_name;
  
  UnderscoresToCamelCase(&field_name,*(string **)(this + 8),true);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&AStack_a8,"k"
                 ,&field_name);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&AStack_a8,
                 "FieldNumber");
  std::__cxx11::string::~string((string *)&AStack_a8);
  if (((byte)this[1] & 8) == 0) {
    pFVar1 = Descriptor::FindFieldByCamelcaseName
                       (*(Descriptor **)(this + 0x20),
                        (ConstStringParam)
                        ((ulong)(((byte)this[3] & 0xc) << 3) + *(long *)(this + 8)));
    if (pFVar1 != (FieldDescriptor *)this) {
      strings::AlphaNum::AlphaNum(&AStack_a8,*(int *)(this + 4));
      StrCat_abi_cxx11_(&local_78,(protobuf *)&AStack_a8,a);
      std::operator+(&local_58,"_",&local_78);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  std::__cxx11::string::~string((string *)&field_name);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldConstantName(const FieldDescriptor* field) {
  std::string field_name = UnderscoresToCamelCase(field->name(), true);
  std::string result = "k" + field_name + "FieldNumber";

  if (!field->is_extension() &&
      field->containing_type()->FindFieldByCamelcaseName(
          field->camelcase_name()) != field) {
    // This field's camelcase name is not unique.  As a hack, add the field
    // number to the constant name.  This makes the constant rather useless,
    // but what can we do?
    result += "_" + StrCat(field->number());
  }

  return result;
}